

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallRef(InternalAnalyzer *this,CallRef *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  uintptr_t in_RAX;
  Type *this_00;
  HeapType local_28;
  
  this_00 = &curr->target->type;
  local_28.id = in_RAX;
  bVar2 = wasm::Type::isRef(this_00);
  if (bVar2) {
    local_28 = wasm::Type::getHeapType(this_00);
    bVar2 = HeapType::isBottom(&local_28);
    if (bVar2) {
      this->parent->trap = true;
      return;
    }
  }
  pEVar1 = this->parent;
  pEVar1->calls = true;
  if ((((pEVar1->features).features & 0x40) != 0) && (pEVar1->tryDepth == 0)) {
    pEVar1->throws_ = true;
  }
  if (curr->isReturn == true) {
    pEVar1->branchesOut = true;
  }
  bVar2 = wasm::Type::isNullable(&curr->target->type);
  if (bVar2) {
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
      if (curr->target->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.calls = true;
      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }
      if (curr->isReturn) {
        parent.branchesOut = true;
      }
      // traps when the call target is null
      if (curr->target->type.isNullable()) {
        parent.implicitTrap = true;
      }
    }